

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

CatalogEntry * __thiscall
duckdb::Catalog::GetEntry
          (Catalog *this,ClientContext *context,CatalogType catalog_type,string *schema_name,
          string *name)

{
  CatalogEntry *pCVar1;
  EntryLookupInfo lookup_info;
  
  EntryLookupInfo::EntryLookupInfo
            (&lookup_info,catalog_type,name,(QueryErrorContext)0xffffffffffffffff);
  pCVar1 = GetEntry(this,context,schema_name,&lookup_info);
  return pCVar1;
}

Assistant:

CatalogEntry &Catalog::GetEntry(ClientContext &context, CatalogType catalog_type, const string &schema_name,
                                const string &name) {
	EntryLookupInfo lookup_info(catalog_type, name);
	return GetEntry(context, schema_name, lookup_info);
}